

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeVersionedName
          (cmGeneratorTarget *this,string *vName,string *prefix,string *base,string *suffix,
          string *name,cmValue version)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  allocator<char> local_d9;
  string local_d8;
  string local_b8 [55];
  allocator<char> local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  string *name_local;
  string *suffix_local;
  string *base_local;
  string *prefix_local;
  string *vName_local;
  cmGeneratorTarget *this_local;
  cmValue version_local;
  
  this_local = (cmGeneratorTarget *)version.Value;
  pcVar1 = this->Makefile;
  local_40 = name;
  name_local = suffix;
  suffix_local = base;
  base_local = prefix;
  prefix_local = vName;
  vName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"APPLE",&local_81);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_80);
  if (bVar2) {
    std::operator+(&local_60,base_local,suffix_local);
  }
  else {
    std::__cxx11::string::string((string *)&local_60,(string *)local_40);
  }
  std::__cxx11::string::operator=((string *)prefix_local,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  bVar2 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
  if (bVar2) {
    std::__cxx11::string::operator+=((string *)prefix_local,".");
    psVar3 = cmValue::operator*[abi_cxx11_((cmValue *)&this_local);
    std::__cxx11::string::operator+=((string *)prefix_local,(string *)psVar3);
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"APPLE",&local_d9);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_d8);
  if (bVar2) {
    std::__cxx11::string::string(local_b8,(string *)name_local);
  }
  else {
    std::__cxx11::string::string(local_b8);
  }
  std::__cxx11::string::operator+=((string *)prefix_local,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeVersionedName(
  std::string& vName, std::string const& prefix, std::string const& base,
  std::string const& suffix, std::string const& name, cmValue version) const
{
  vName = this->Makefile->IsOn("APPLE") ? (prefix + base) : name;
  if (version) {
    vName += ".";
    vName += *version;
  }
  vName += this->Makefile->IsOn("APPLE") ? suffix : std::string();
}